

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cpp
# Opt level: O3

int __thiscall Board::countStonesFor(Board *this,Player *p)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar2 = (long)this->size;
  if (0 < lVar2) {
    lVar3 = 0;
    iVar1 = 0;
    do {
      lVar4 = 0;
      do {
        iVar1 = iVar1 + (uint)(*(Player **)
                                (*(long *)&(this->table).
                                           super__Vector_base<std::vector<Cell,_std::allocator<Cell>_>,_std::allocator<std::vector<Cell,_std::allocator<Cell>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[lVar3].
                                           super__Vector_base<Cell,_std::allocator<Cell>_>._M_impl.
                                           super__Vector_impl_data + 0x10 + lVar4) == p);
        lVar4 = lVar4 + 0x18;
      } while (lVar2 * 0x18 != lVar4);
      lVar3 = lVar3 + 1;
    } while (lVar3 != lVar2);
    return iVar1;
  }
  return 0;
}

Assistant:

int Board::countStonesFor(const Player *p){

    int count=0;
    for (int row=0; row<size; row++){
        for (int col=0; col<size; col++){
            if (getCell(row,col).belongsTo(p)){
                count++;
            }
        }
    }
    return count;
}